

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_privkey.cc
# Opt level: O2

ssl_private_key_result_t
bssl::ssl_private_key_sign
          (SSL_HANDSHAKE *hs,uint8_t *out,size_t *out_len,size_t max_out,uint16_t sigalg,
          Span<const_unsigned_char> in)

{
  SSL *ssl;
  ssl_credential_st *psVar1;
  SSL_HANDSHAKE_HINTS *pSVar2;
  uchar *puVar3;
  size_t sVar4;
  size_t __n;
  SSL_PRIVATE_KEY_METHOD *pSVar5;
  __uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true> pkey;
  bool bVar6;
  int iVar7;
  ssl_private_key_result_t sVar8;
  Span<const_unsigned_char> in_00;
  Array<unsigned_char> spki;
  ScopedCBB spki_cbb;
  
  ssl = hs->ssl;
  psVar1 = (hs->credential)._M_t.super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>.
           _M_t.super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl;
  pSVar2 = (hs->hints)._M_t.
           super___uniq_ptr_impl<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_HANDSHAKE_HINTS_*,_false>._M_head_impl;
  spki.data_ = (uchar *)0x0;
  spki.size_ = 0;
  if (pSVar2 != (SSL_HANDSHAKE_HINTS *)0x0) {
    CBB_zero(&spki_cbb.ctx_);
    iVar7 = CBB_init(&spki_cbb.ctx_,0x40);
    if (((iVar7 == 0) ||
        (iVar7 = EVP_marshal_public_key
                           (&spki_cbb.ctx_,
                            (EVP_PKEY *)
                            (psVar1->pubkey)._M_t.
                            super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>), iVar7 == 0
        )) || (bVar6 = CBBFinishArray(&spki_cbb.ctx_,&spki), !bVar6)) {
      sVar8 = ssl_private_key_failure;
      ssl_send_alert(ssl,2,0x50);
      internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&spki_cbb);
      goto LAB_001549ea;
    }
    internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated(&spki_cbb);
    if ((((hs->field_0x6ca & 0x10) == 0) && (pSVar2->signature_algorithm == sigalg)) &&
       ((puVar3 = (pSVar2->signature_input).data_,
        bVar6 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                          (in.data_,in.data_ + in.size_,puVar3,
                           puVar3 + (pSVar2->signature_input).size_), bVar6 &&
        ((puVar3 = (pSVar2->signature_spki).data_,
         bVar6 = std::__equal4<unsigned_char_const*,unsigned_char_const*>
                           (spki.data_,spki.data_ + spki.size_,puVar3,
                            puVar3 + (pSVar2->signature_spki).size_), bVar6 &&
         (sVar4 = (pSVar2->signature).size_, sVar4 - 1 < max_out)))))) {
      *out_len = sVar4;
      __n = (pSVar2->signature).size_;
      sVar8 = ssl_private_key_success;
      if (__n != 0) {
        memcpy(out,(pSVar2->signature).data_,__n);
      }
      goto LAB_001549ea;
    }
  }
  if ((*(uint *)&hs->field_0x6c8 >> 0x17 & 1) != 0) {
    __assert_fail("!hs->can_release_private_key",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                  ,0xe4,
                  "enum ssl_private_key_result_t bssl::ssl_private_key_sign(SSL_HANDSHAKE *, uint8_t *, size_t *, size_t, uint16_t, Span<const uint8_t>)"
                 );
  }
  pSVar5 = psVar1->key_method;
  if (pSVar5 == (SSL_PRIVATE_KEY_METHOD *)0x0) {
    pkey.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl =
         (psVar1->privkey)._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>;
    *out_len = max_out;
    EVP_MD_CTX_init((EVP_MD_CTX *)&spki_cbb);
    bVar6 = setup_ctx(ssl,(EVP_MD_CTX *)&spki_cbb,
                      (EVP_PKEY *)
                      pkey.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl,sigalg,false);
    if ((!bVar6) ||
       (iVar7 = EVP_DigestSign((EVP_MD_CTX *)&spki_cbb,out,out_len,in.data_,in.size_), iVar7 == 0))
    {
      internal::
      StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
      ::~StackAllocatedMovable
                ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                  *)&spki_cbb);
      sVar8 = ssl_private_key_failure;
      goto LAB_001549ea;
    }
    internal::
    StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
    ::~StackAllocatedMovable
              ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                *)&spki_cbb);
  }
  else {
    if ((*(uint *)&hs->field_0x6c8 >> 0x12 & 1) == 0) {
      sVar8 = (*pSVar5->sign)(ssl,out,out_len,max_out,sigalg,in.data_,in.size_);
    }
    else {
      sVar8 = (*pSVar5->complete)(ssl,out,out_len,max_out);
    }
    if (sVar8 == ssl_private_key_failure) {
      ERR_put_error(0x10,0,0x11f,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_privkey.cc"
                    ,0xef);
    }
    *(uint *)&hs->field_0x6c8 =
         *(uint *)&hs->field_0x6c8 & 0xfffbffff | (uint)(sVar8 == ssl_private_key_retry) << 0x12;
    if (sVar8 != ssl_private_key_success) goto LAB_001549ea;
  }
  if ((pSVar2 != (SSL_HANDSHAKE_HINTS *)0x0) && ((hs->field_0x6ca & 0x10) != 0)) {
    pSVar2->signature_algorithm = sigalg;
    Array<unsigned_char>::operator=(&pSVar2->signature_spki,&spki);
    bVar6 = Array<unsigned_char>::CopyFrom(&pSVar2->signature_input,in);
    sVar8 = ssl_private_key_failure;
    if ((!bVar6) ||
       (in_00.size_ = *out_len, in_00.data_ = out,
       bVar6 = Array<unsigned_char>::CopyFrom(&pSVar2->signature,in_00), !bVar6)) goto LAB_001549ea;
  }
  sVar8 = ssl_private_key_success;
LAB_001549ea:
  Array<unsigned_char>::~Array(&spki);
  return sVar8;
}

Assistant:

enum ssl_private_key_result_t ssl_private_key_sign(
    SSL_HANDSHAKE *hs, uint8_t *out, size_t *out_len, size_t max_out,
    uint16_t sigalg, Span<const uint8_t> in) {
  SSL *const ssl = hs->ssl;
  const SSL_CREDENTIAL *const cred = hs->credential.get();
  SSL_HANDSHAKE_HINTS *const hints = hs->hints.get();
  Array<uint8_t> spki;
  if (hints) {
    ScopedCBB spki_cbb;
    if (!CBB_init(spki_cbb.get(), 64) ||
        !EVP_marshal_public_key(spki_cbb.get(), cred->pubkey.get()) ||
        !CBBFinishArray(spki_cbb.get(), &spki)) {
      ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
      return ssl_private_key_failure;
    }
  }

  // Replay the signature from handshake hints if available.
  if (hints && !hs->hints_requested &&         //
      sigalg == hints->signature_algorithm &&  //
      in == hints->signature_input &&          //
      Span(spki) == hints->signature_spki &&   //
      !hints->signature.empty() &&             //
      hints->signature.size() <= max_out) {
    // Signature algorithm and input both match. Reuse the signature from hints.
    *out_len = hints->signature.size();
    OPENSSL_memcpy(out, hints->signature.data(), hints->signature.size());
    return ssl_private_key_success;
  }

  const SSL_PRIVATE_KEY_METHOD *key_method = cred->key_method;
  EVP_PKEY *privkey = cred->privkey.get();
  assert(!hs->can_release_private_key);

  if (key_method != NULL) {
    enum ssl_private_key_result_t ret;
    if (hs->pending_private_key_op) {
      ret = key_method->complete(ssl, out, out_len, max_out);
    } else {
      ret = key_method->sign(ssl, out, out_len, max_out, sigalg, in.data(),
                             in.size());
    }
    if (ret == ssl_private_key_failure) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_PRIVATE_KEY_OPERATION_FAILED);
    }
    hs->pending_private_key_op = ret == ssl_private_key_retry;
    if (ret != ssl_private_key_success) {
      return ret;
    }
  } else {
    *out_len = max_out;
    ScopedEVP_MD_CTX ctx;
    if (!setup_ctx(ssl, ctx.get(), privkey, sigalg, false /* sign */) ||
        !EVP_DigestSign(ctx.get(), out, out_len, in.data(), in.size())) {
      return ssl_private_key_failure;
    }
  }

  // Save the hint if applicable.
  if (hints && hs->hints_requested) {
    hints->signature_algorithm = sigalg;
    hints->signature_spki = std::move(spki);
    if (!hints->signature_input.CopyFrom(in) ||
        !hints->signature.CopyFrom(Span(out, *out_len))) {
      return ssl_private_key_failure;
    }
  }
  return ssl_private_key_success;
}